

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

RegSlot __thiscall ByteCodeGenerator::AssignTrueConstRegister(ByteCodeGenerator *this)

{
  FuncInfo *this_00;
  RegSlot RVar1;
  Type *ppFVar2;
  
  ppFVar2 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  this_00 = *ppFVar2;
  if (this_00->trueConstantRegister == 0xffffffff) {
    RVar1 = FuncInfo::NextConstRegister(this_00);
    this_00->trueConstantRegister = RVar1;
  }
  return this_00->trueConstantRegister;
}

Assistant:

Js::RegSlot ByteCodeGenerator::AssignTrueConstRegister()
{
    FuncInfo *top = funcInfoStack->Top();
    return top->AssignTrueConstRegister();
}